

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdConfigDirWrapper.cpp
# Opt level: O3

QString * __thiscall
LdConfigDirWrapper::getFieldName
          (QString *__return_storage_ptr__,LdConfigDirWrapper *this,size_t fieldId)

{
  Executable *pEVar1;
  int iVar2;
  char *pcVar3;
  char *ch;
  QByteArrayView QVar4;
  Data *local_38;
  char16_t *pcStack_30;
  qsizetype local_28;
  
  pEVar1 = (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
           super_ExeElementWrapper.m_Exe;
  if (pEVar1 == (Executable *)0x0) {
    QVar4.m_data = (storage_type *)0x0;
    QVar4.m_size = (qsizetype)&local_38;
    QString::fromUtf8(QVar4);
    (__return_storage_ptr__->d).d = local_38;
    (__return_storage_ptr__->d).ptr = pcStack_30;
    (__return_storage_ptr__->d).size = local_28;
    return __return_storage_ptr__;
  }
  iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xb])();
  switch(fieldId) {
  case 0:
    ch = "Size";
    break;
  case 1:
    ch = "TimeDateStamp";
    break;
  case 2:
    ch = "MajorVersion";
    break;
  case 3:
    ch = "MinorVersion";
    break;
  case 4:
    ch = "GlobalFlagsClear";
    break;
  case 5:
    ch = "GlobalFlagsSet";
    break;
  case 6:
    ch = "CriticalSectionDefaultTimeout";
    break;
  case 7:
    ch = "DeCommitFreeBlockThreshold";
    break;
  case 8:
    ch = "DeCommitTotalFreeThreshold";
    break;
  case 9:
    ch = "LockPrefixTable";
    break;
  case 10:
    ch = "MaximumAllocationSize";
    break;
  case 0xb:
    ch = "VirtualMemoryThreshold";
    break;
  case 0xc:
    pcVar3 = "ProcessHeapFlags";
    ch = "ProcessAffinityMask";
    goto LAB_00134af8;
  case 0xd:
    pcVar3 = "ProcessAffinityMask";
    ch = "ProcessHeapFlags";
LAB_00134af8:
    if (iVar2 == 0x20) {
      ch = pcVar3;
    }
    break;
  case 0xe:
    ch = "CSDVersion";
    break;
  case 0xf:
    ch = "DependentLoadFlags";
    break;
  case 0x10:
    ch = "EditList";
    break;
  case 0x11:
    ch = "SecurityCookie";
    break;
  case 0x12:
    ch = "SEHandlerTable";
    break;
  case 0x13:
    ch = "SEHandlerCount";
    break;
  case 0x14:
    ch = "GuardCFCheckFunctionPtr";
    break;
  case 0x15:
    ch = "GuardCFDispatchFunctionPointer";
    break;
  case 0x16:
    ch = "GuardCFFunctionTable";
    break;
  case 0x17:
    ch = "GuardCFFunctionCount";
    break;
  case 0x18:
    ch = "GuardFlags";
    break;
  case 0x19:
    ch = "CodeIntegrity.Flags";
    break;
  case 0x1a:
    ch = "CodeIntegrity.Catalog";
    break;
  case 0x1b:
    ch = "CodeIntegrity.CatalogOffset";
    break;
  case 0x1c:
    ch = "CodeIntegrity.Reserved";
    break;
  case 0x1d:
    ch = "GuardAddressTakenIatEntryTable";
    break;
  case 0x1e:
    ch = "GuardAddressTakenIatEntryCount";
    break;
  case 0x1f:
    ch = "GuardLongJumpTargetTable";
    break;
  case 0x20:
    ch = "GuardLongJumpTargetCount";
    break;
  case 0x21:
    ch = "DynamicValueRelocTable";
    break;
  case 0x22:
    ch = "CHPEMetadataPointer";
    break;
  case 0x23:
    ch = "GuardRFFailureRoutine";
    break;
  case 0x24:
    ch = "GuardRFFailureRoutineFunctionPointer";
    break;
  case 0x25:
    ch = "DynamicValueRelocTableOffset";
    break;
  case 0x26:
    ch = "DynamicValueRelocTableSection";
    break;
  case 0x27:
    ch = "Reserved2";
    break;
  case 0x28:
    ch = "GuardRFVerifyStackPointerFunctionPointer";
    break;
  case 0x29:
    ch = "HotPatchTableOffset";
    break;
  case 0x2a:
    ch = "Reserved3";
    break;
  case 0x2b:
    ch = "EnclaveConfigurationPointer";
    break;
  case 0x2c:
    ch = "VolatileMetadataPointer";
    break;
  case 0x2d:
    ch = "GuardEHContinuationTable";
    break;
  case 0x2e:
    ch = "GuardEHContinuationCount";
    break;
  default:
    (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
      super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xe])
              (__return_storage_ptr__,this);
    return __return_storage_ptr__;
  }
  QString::QString(__return_storage_ptr__,ch);
  return __return_storage_ptr__;
}

Assistant:

QString LdConfigDirWrapper::getFieldName(size_t fieldId)
{
    if (!m_Exe) return "";
    const bool is32bit = (m_Exe->getBitMode() == Executable::BITS_32);
    switch (fieldId) {
        case SIZE : return "Size";
        case TIMEST : return "TimeDateStamp";
        case MAJOR_VER : return "MajorVersion";
        case MINOR_VER : return "MinorVersion";
        case GLOBAL_FLAGS_CLEAR : return "GlobalFlagsClear";
        case GLOBAL_FLAGS_SET : return "GlobalFlagsSet";
        case CRITICAT_SEC_TIMEOUT : return "CriticalSectionDefaultTimeout";
        case DECOMMIT_FREE : return "DeCommitFreeBlockThreshold";
        case DECOMMIT_TOTAL : return "DeCommitTotalFreeThreshold";
        case LOCK_PREFIX : return "LockPrefixTable";
        case MAX_ALLOC : return "MaximumAllocationSize";
        case VIRTUAL_MEM : return "VirtualMemoryThreshold";
        case PROC_HEAP_FLAGS32 : //PROC_AFF_MASK64
        {
            return (is32bit) ? "ProcessHeapFlags" : "ProcessAffinityMask";
        }
        case PROC_AFF_MASK32 : // PROC_HEAP_FLAGS64
        {
            return (is32bit) ? "ProcessAffinityMask" : "ProcessHeapFlags";
        }
        case CSD_VER : return "CSDVersion";
        case DEPENDENT_LOAD_FLAGS : return "DependentLoadFlags";
        case EDIT_LIST : return "EditList";
        case SEC_COOKIE : return "SecurityCookie";
        case SEH_TABLE : return "SEHandlerTable";
        case SEH_COUNT : return "SEHandlerCount";
        // W8.1 part :
        case GUARD_CHECK : return "GuardCFCheckFunctionPtr";
        case GUARD_DISPATCH : return "GuardCFDispatchFunctionPointer";
        case GUARD_TABLE: return "GuardCFFunctionTable";
        case GUARD_COUNT: return "GuardCFFunctionCount";
        case GUARD_FLAGS: return "GuardFlags";
        // W10 part:
        case CODE_INTEGRITY_FLAGS: return "CodeIntegrity.Flags"; //IMAGE_LOAD_CONFIG_CODE_INTEGRITY.Flags
        case CODE_INTEGRITY_CATALOG:  return "CodeIntegrity.Catalog";  //IMAGE_LOAD_CONFIG_CODE_INTEGRITY.Catalog
        case CODE_INTEGRITY_CATALOG_OFFSET:  return "CodeIntegrity.CatalogOffset"; //IMAGE_LOAD_CONFIG_CODE_INTEGRITY.CatalogOffset
        case CODE_INTEGRITY_RESERVED:  return "CodeIntegrity.Reserved"; //IMAGE_LOAD_CONFIG_CODE_INTEGRITY.Reserved

        case GUARD_ADDR_IAT_ENTRY_TABLE:  return "GuardAddressTakenIatEntryTable";
        case GUARD_ADDR_IAT_ENTRY_COUNT:  return "GuardAddressTakenIatEntryCount";
        case GUARD_LONG_JUMP_TABLE:  return "GuardLongJumpTargetTable";
        case GUARD_LONG_JUMP_COUNT:  return "GuardLongJumpTargetCount";

        case DYNAMIC_VAL_RELOC:  return "DynamicValueRelocTable";
        case CHPE_METADATA_PTR:  return "CHPEMetadataPointer";
        case GUARD_FAILURE_ROUTINE:  return "GuardRFFailureRoutine";
        case GUARD_FAILURE_ROUTINE_FUNC_PTR:  return "GuardRFFailureRoutineFunctionPointer";
        case DYNAMIC_VAL_RELOC_TABLE_OFFSET:  return "DynamicValueRelocTableOffset";
        case DYNAMIC_VAL_RELOC_TABLE_SECTION: return "DynamicValueRelocTableSection";
        case RESERVED2:  return "Reserved2";
        case GUARD_VERIFY_STACK_PTR:  return "GuardRFVerifyStackPointerFunctionPointer";
        case HOT_PATCH_TABLE_OFFSET:  return "HotPatchTableOffset";
        case RESERVED3:  return "Reserved3";
        case ENCLAVE_CONFIG_PTR:  return "EnclaveConfigurationPointer";
        case VOLATILE_METADATA_PTR:  return "VolatileMetadataPointer";
        case GUARD_EH_CONT_TABLE:  return "GuardEHContinuationTable";
        case GUARD_EH_CONT_COUNT:  return "GuardEHContinuationCount";
    }
    return getName();
}